

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_cross_entropy_loss::build_graph(test_cross_entropy_loss *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  ggml_context *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *labels;
  ggml_tensor *logits;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  ggml_context *in_stack_ffffffffffffffc8;
  ggml_context *ctx_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar5;
  
  uVar4 = *(undefined4 *)(in_RDI + 0x38);
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1abb32);
  pgVar1 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"logits");
  uVar5 = *(undefined4 *)(in_RDI + 0x38);
  ctx_00 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1abb91);
  pgVar2 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),ctx_00,
                      (ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
  ggml_set_name(pgVar2,"labels");
  uVar3 = ggml_soft_max(in_RSI,pgVar2);
  ggml_set_name(uVar3,"labels_normalized");
  pgVar1 = (ggml_tensor *)ggml_cross_entropy_loss(in_RSI,pgVar1,uVar3);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * logits = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, logits);
        ggml_set_name(logits, "logits");

        ggml_tensor * labels = ggml_new_tensor(ctx, type, 4, ne.data());
        // The labels are assumed to be constant -> no gradients.
        ggml_set_name(labels, "labels");

        // Ensure labels add up to 1:
        labels = ggml_soft_max(ctx, labels);
        ggml_set_name(labels, "labels_normalized");

        ggml_tensor * out = ggml_cross_entropy_loss(ctx, logits, labels);
        ggml_set_name(out, "out");

        return out;
    }